

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O2

void rep0_pipe_recv_cb(void *arg)

{
  nni_aio *aio;
  nni_list *list;
  char cVar1;
  nni_mtx *mtx;
  nni_aio *aio_00;
  nng_err nVar2;
  int iVar3;
  nni_msg *m;
  size_t sVar4;
  char *data;
  undefined1 *item;
  void *__src;
  int iVar5;
  
  mtx = *(nni_mtx **)((long)arg + 8);
  aio = (nni_aio *)((long)arg + 0x1e0);
  nVar2 = nni_aio_result(aio);
  if (nVar2 != NNG_OK) {
LAB_0011b636:
    nni_pipe_close(*arg);
    return;
  }
  m = nni_aio_get_msg(aio);
  iVar3 = nni_atomic_get((nni_atomic_int *)(mtx + 1));
  nni_msg_set_pipe(m,*(uint32_t *)((long)arg + 0x10));
  iVar5 = 0;
  if (0 < iVar3) {
    iVar5 = iVar3;
  }
  iVar5 = iVar5 + 1;
  do {
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
LAB_0011b718:
      nni_msg_free(m);
      nni_aio_set_msg(aio,(nni_msg *)0x0);
      nni_pipe_recv(*arg,aio);
      return;
    }
    sVar4 = nni_msg_len(m);
    if (sVar4 < 4) {
      nni_msg_free(m);
      nni_aio_set_msg(aio,(nni_msg *)0x0);
      goto LAB_0011b636;
    }
    data = (char *)nni_msg_body(m);
    cVar1 = *data;
    iVar3 = nni_msg_header_append(m,data,4);
    if (iVar3 != 0) goto LAB_0011b718;
    nni_msg_trim(m,4);
    if (cVar1 < '\0') {
      sVar4 = nni_msg_header_len(m);
      nni_mtx_lock(mtx);
      if (*(char *)((long)arg + 0x3d1) == '\x01') {
        nni_aio_set_msg(aio,(nni_msg *)0x0);
        nni_mtx_unlock(mtx);
        nni_msg_free(m);
        return;
      }
      list = (nni_list *)((long)&mtx[3].mtx + 8);
      item = (undefined1 *)nni_list_first(list);
      if (item != (undefined1 *)0x0) {
        nni_list_remove(list,item);
        aio_00 = *(nni_aio **)(item + 0x20);
        *(undefined8 *)(item + 0x20) = 0;
        nni_aio_set_msg(aio,(nni_msg *)0x0);
        if ((item == (undefined1 *)((long)&mtx[3].mtx + 0x20)) &&
           (*(char *)((long)arg + 0x3d0) == '\0')) {
          nni_pollable_raise((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
        }
        nni_pipe_recv(*arg,aio);
        *(size_t *)(item + 0x48) = sVar4;
        __src = nni_msg_header(m);
        memcpy(item + 0x50,__src,sVar4);
        nni_msg_header_clear(m);
        *(undefined4 *)(item + 8) = *(undefined4 *)((long)arg + 0x10);
        nni_mtx_unlock(mtx);
        nni_aio_set_msg(aio_00,m);
        sVar4 = nni_msg_len(m);
        nni_aio_finish_sync(aio_00,NNG_OK,sVar4);
        return;
      }
      nni_list_append((nni_list *)&mtx[2].mtx.__data.__list,arg);
      nni_pollable_raise((nni_pollable *)((long)&mtx[7].mtx + 0x10));
      nni_mtx_unlock(mtx);
      return;
    }
  } while( true );
}

Assistant:

static void
rep0_pipe_recv_cb(void *arg)
{
	rep0_pipe *p = arg;
	rep0_sock *s = p->rep;
	rep0_ctx  *ctx;
	nni_msg   *msg;
	uint8_t   *body;
	nni_aio   *aio;
	size_t     len;
	int        hops;
	int        ttl;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_recv);
	ttl = nni_atomic_get(&s->ttl);

	nni_msg_set_pipe(msg, p->id);

	// Move backtrace from body to header
	hops = 1;
	for (;;) {
		bool end;

		if (hops > ttl) {
			// This isn't malformed, but it has gone
			// through too many hops.  Do not disconnect,
			// because we can legitimately receive messages
			// with too many hops from devices, etc.
			goto drop;
		}
		hops++;
		if (nni_msg_len(msg) < 4) {
			// Peer is speaking garbage. Kick it.
			nni_msg_free(msg);
			nni_aio_set_msg(&p->aio_recv, NULL);
			nni_pipe_close(p->pipe);
			return;
		}
		body = nni_msg_body(msg);
		end  = ((body[0] & 0x80u) != 0);
		if (nni_msg_header_append(msg, body, 4) != 0) {
			// Out of memory, so drop it.
			goto drop;
		}
		nni_msg_trim(msg, 4);
		if (end) {
			break;
		}
	}

	len = nni_msg_header_len(msg);

	nni_mtx_lock(&s->lk);

	if (p->closed) {
		// If we are closed, then we can't return data.
		nni_aio_set_msg(&p->aio_recv, NULL);
		nni_mtx_unlock(&s->lk);
		nni_msg_free(msg);
		return;
	}

	if ((ctx = nni_list_first(&s->recvq)) == NULL) {
		// No one waiting to receive yet, holding pattern.
		nni_list_append(&s->recvpipes, p);
		nni_pollable_raise(&s->readable);
		nni_mtx_unlock(&s->lk);
		return;
	}

	nni_list_remove(&s->recvq, ctx);
	aio       = ctx->raio;
	ctx->raio = NULL;
	nni_aio_set_msg(&p->aio_recv, NULL);
	if ((ctx == &s->ctx) && !p->busy) {
		nni_pollable_raise(&s->writable);
	}

	// schedule another receive
	nni_pipe_recv(p->pipe, &p->aio_recv);

	ctx->btrace_len = len;
	memcpy(ctx->btrace, nni_msg_header(msg), len);
	nni_msg_header_clear(msg);
	ctx->pipe_id = p->id;

	nni_mtx_unlock(&s->lk);

	nni_aio_set_msg(aio, msg);
	nni_aio_finish_sync(aio, 0, nni_msg_len(msg));
	return;

drop:
	nni_msg_free(msg);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_pipe_recv(p->pipe, &p->aio_recv);
}